

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

key_components * ecdsa_components(ssh_key *key)

{
  mp_int *local_30;
  mp_int *y;
  mp_int *x;
  key_components *kc;
  ecdsa_key *ek;
  ssh_key *key_local;
  
  kc = (key_components *)(key + -3);
  ek = (ecdsa_key *)key;
  x = (mp_int *)key_components_new();
  key_components_add_text((key_components *)x,"key_type","ECDSA");
  key_components_add_text((key_components *)x,"curve_name",*(char **)(kc->ncomponents + 0x10));
  ecc_weierstrass_get_affine((WeierstrassPoint *)kc->componentsize,&y,&local_30);
  key_components_add_mp((key_components *)x,"public_affine_x",y);
  key_components_add_mp((key_components *)x,"public_affine_y",local_30);
  mp_free(y);
  mp_free(local_30);
  if (kc->components != (key_component *)0x0) {
    key_components_add_mp((key_components *)x,"private_exponent",(mp_int *)kc->components);
  }
  return (key_components *)x;
}

Assistant:

static key_components *ecdsa_components(ssh_key *key)
{
    struct ecdsa_key *ek = container_of(key, struct ecdsa_key, sshk);
    key_components *kc = key_components_new();

    key_components_add_text(kc, "key_type", "ECDSA");
    key_components_add_text(kc, "curve_name", ek->curve->textname);

    mp_int *x, *y;
    ecc_weierstrass_get_affine(ek->publicKey, &x, &y);
    key_components_add_mp(kc, "public_affine_x", x);
    key_components_add_mp(kc, "public_affine_y", y);
    mp_free(x);
    mp_free(y);

    if (ek->privateKey)
        key_components_add_mp(kc, "private_exponent", ek->privateKey);

    return kc;
}